

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

Cord * __thiscall absl::lts_20250127::Cord::AssignLargeString(Cord *this,string *src)

{
  Nonnull<CordRep_*> rep;
  Nullable<absl::cord_internal::CordRep_*> rep_00;
  CordzInfo *info;
  CordzUpdateScope scope;
  
  if (0x1ff < src->_M_string_length) {
    rep = CordRepFromString(src);
    rep_00 = InlineRep::tree(&this->contents_);
    if (rep_00 == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
      InlineRep::EmplaceTree(&this->contents_,rep,kAssignString);
    }
    else {
      info = cord_internal::InlineData::cordz_info((InlineData *)this);
      cord_internal::CordzUpdateScope::CordzUpdateScope(&scope,info,kAssignString);
      InlineRep::SetTree(&this->contents_,rep,&scope);
      cord_internal::CordRep::Unref(rep_00);
      cord_internal::CordzUpdateScope::~CordzUpdateScope(&scope);
    }
    return this;
  }
  __assert_fail("src.size() > kMaxBytesToCopy",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                ,0x17b,"Cord &absl::Cord::AssignLargeString(std::string &&)");
}

Assistant:

Cord& Cord::AssignLargeString(std::string&& src) {
  auto constexpr method = CordzUpdateTracker::kAssignString;
  assert(src.size() > kMaxBytesToCopy);
  CordRep* rep = CordRepFromString(std::move(src));
  if (CordRep* tree = contents_.tree()) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    contents_.SetTree(rep, scope);
    CordRep::Unref(tree);
  } else {
    contents_.EmplaceTree(rep, method);
  }
  return *this;
}